

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  connectdata *conn;
  uchar uVar1;
  byte httpversion;
  _Bool _Var2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  bool bVar16;
  char *in_stack_ffffffffffffff48;
  Curl_HttpReq httpreq;
  char *local_98;
  char *local_90;
  dynbuf req;
  char *te;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *request;
  
  conn = data->conn;
  te = "";
  *done = true;
  if (((conn->alpn == '\x03') && (uVar1 = Curl_conn_http_version(data,conn), uVar1 != '\x14')) &&
     (((ulong)conn->bits & 0x18) == 0x10)) {
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  CVar3 = Curl_headers_init(data);
  if (CVar3 != CURLE_OK) goto LAB_00133bc3;
  if (((data->state).field_0x7be & 8) == 0) {
    (*Curl_cfree)((data->state).first_host);
    pcVar5 = (*Curl_cstrdup)((conn->host).name);
    (data->state).first_host = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).first_remote_port = conn->remote_port;
    (data->state).first_remote_protocol = conn->handler->protocol;
  }
  (*Curl_cfree)((data->state).aptr.host);
  (data->state).aptr.host = (char *)0x0;
  pcVar5 = Curl_checkheaders(data,"Host",4);
  if ((pcVar5 == (char *)0x0) ||
     ((((data->state).field_0x7be & 8) != 0 &&
      (iVar4 = curl_strequal((data->state).first_host,(conn->host).name), iVar4 == 0)))) {
    pcVar5 = (conn->host).name;
    uVar15 = conn->given->protocol;
    if (((uVar15 & 0x80000002) == 0 || conn->remote_port != 0x1bb) &&
       (conn->remote_port != 0x50 || (uVar15 & 0x40000001) == 0)) {
      bVar16 = (*(uint *)&conn->bits >> 10 & 1) == 0;
      pcVar6 = "[";
      if (bVar16) {
        pcVar6 = "";
      }
      pcVar9 = "]";
      if (bVar16) {
        pcVar9 = "";
      }
      pcVar5 = curl_maprintf("Host: %s%s%s:%d\r\n",pcVar6,pcVar5,pcVar9);
    }
    else {
      bVar16 = (*(uint *)&conn->bits >> 10 & 1) == 0;
      pcVar6 = "[";
      if (bVar16) {
        pcVar6 = "";
      }
      pcVar9 = "]";
      if (bVar16) {
        pcVar9 = "";
      }
      pcVar5 = curl_maprintf("Host: %s%s%s\r\n",pcVar6,pcVar5,pcVar9);
    }
    (data->state).aptr.host = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar6 = Curl_copy_header_value(in_stack_ffffffffffffff48);
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*pcVar6 == '[') {
      sVar7 = strlen(pcVar6);
      memmove(pcVar6,pcVar6 + 1,sVar7 - 1);
      iVar4 = 0x5d;
LAB_00133dcf:
      pcVar9 = strchr(pcVar6,iVar4);
      if (pcVar9 != (char *)0x0) {
        *pcVar9 = '\0';
      }
      (*Curl_cfree)((data->state).aptr.cookiehost);
      (data->state).aptr.cookiehost = pcVar6;
    }
    else {
      if (*pcVar6 != '\0') {
        iVar4 = 0x3a;
        goto LAB_00133dcf;
      }
      (*Curl_cfree)(pcVar6);
    }
    iVar4 = curl_strequal("Host:",pcVar5);
    if (iVar4 == 0) {
      pcVar5 = curl_maprintf("Host:%s\r\n",pcVar5 + 5);
      (data->state).aptr.host = pcVar5;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  pcVar5 = Curl_checkheaders(data,"User-Agent",10);
  if (pcVar5 != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
  }
  Curl_http_method(data,conn,&request,&httpreq);
  pcVar5 = (data->state).up.path;
  if ((data->state).up.query == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar5 = curl_maprintf("%s?%s",pcVar5);
    pcVar6 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  CVar3 = Curl_http_output_auth(data,conn,request,httpreq,pcVar5,false);
  (*Curl_cfree)(pcVar6);
  if (CVar3 == CURLE_OK) {
    (*Curl_cfree)((data->state).aptr.ref);
    (data->state).aptr.ref = (char *)0x0;
    if (((data->state).referer != (char *)0x0) &&
       (pcVar5 = Curl_checkheaders(data,"Referer",7), pcVar5 == (char *)0x0)) {
      pcVar5 = curl_maprintf("Referer: %s\r\n",(data->state).referer);
      (data->state).aptr.ref = pcVar5;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pcVar5 = Curl_checkheaders(data,"Accept-Encoding",0xf);
    if ((pcVar5 == (char *)0x0) && ((data->set).str[0x21] != (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.accept_encoding);
      pcVar5 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[0x21]);
      (data->state).aptr.accept_encoding = pcVar5;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      (*Curl_cfree)((data->state).aptr.accept_encoding);
      (data->state).aptr.accept_encoding = (char *)0x0;
    }
    pcVar5 = Curl_checkheaders(data,"TE",2);
    if ((pcVar5 == (char *)0x0) && (((data->set).field_0x89f & 1) != 0)) {
      pcVar5 = Curl_checkheaders(data,"Connection",10);
      (*Curl_cfree)((data->state).aptr.te);
      (data->state).aptr.te = (char *)0x0;
      if (pcVar5 == (char *)0x0) {
        pcVar6 = "";
        pcVar9 = "";
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar6 = Curl_copy_header_value(in_stack_ffffffffffffff48);
        if (pcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar9 = ", ";
        pcVar5 = pcVar6;
        if (*pcVar6 == '\0') {
          pcVar9 = "";
        }
      }
      pcVar6 = curl_maprintf("Connection: %s%sTE\r\nTE: gzip\r\n",pcVar6,pcVar9);
      (data->state).aptr.te = pcVar6;
      (*Curl_cfree)(pcVar5);
      if ((data->state).aptr.te == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    httpversion = http_request_version(data);
    uVar15 = (uint)httpversion;
    if (httpversion == 0xb) {
      pcVar5 = "1.1";
    }
    else if (uVar15 == 0x1e) {
      pcVar5 = "3";
    }
    else if (uVar15 == 0x14) {
      pcVar5 = "2";
    }
    else {
      pcVar5 = "1.0";
    }
    CVar3 = http_req_set_reader(data,httpreq,uVar15,&te);
    if (CVar3 == CURLE_OK) {
      pcVar6 = Curl_checkheaders(data,"Accept",6);
      CVar3 = http_range(data,httpreq);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      Curl_dyn_init(&req,0x100000);
      Curl_dyn_reset(&(data->state).headerb);
      CVar3 = Curl_dyn_addf(&req,"%s ",request);
      if ((CVar3 == CURLE_OK) && (CVar3 = http_target(data,conn,&req), CVar3 == CURLE_OK)) {
        if ((((ulong)conn->bits & 0x80) == 0) ||
           (pcVar9 = Curl_checkheaders(data,"Alt-Used",8), pcVar9 != (char *)0x0)) {
          local_40 = (char *)0x0;
        }
        else {
          local_40 = curl_maprintf("Alt-Used: %s:%d\r\n",(conn->conn_to_host).name,
                                   (ulong)(uint)conn->conn_to_port);
          if (local_40 == (char *)0x0) {
            Curl_dyn_free(&req);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        pcVar9 = (data->state).aptr.host;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "";
        }
        pcVar10 = (data->state).aptr.proxyuserpwd;
        if (pcVar10 == (char *)0x0) {
          pcVar10 = "";
        }
        pcVar11 = (data->state).aptr.userpwd;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        local_48 = "";
        if (((data->state).field_0x7bf & 4) != 0) {
          pcVar14 = (data->state).aptr.rangeline;
          local_48 = "";
          if (pcVar14 != (char *)0x0) {
            local_48 = pcVar14;
          }
        }
        pcVar14 = (data->set).str[0x2b];
        local_50 = "";
        if ((pcVar14 != (char *)0x0) && (local_50 = "", *pcVar14 != '\0')) {
          pcVar14 = (data->state).aptr.uagent;
          local_50 = "";
          if (pcVar14 != (char *)0x0) {
            local_50 = pcVar14;
          }
        }
        local_58 = "Accept: */*\r\n";
        if (pcVar6 != (char *)0x0) {
          local_58 = "";
        }
        pcVar6 = (data->state).aptr.te;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "";
        }
        pcVar14 = (data->set).str[0x21];
        local_60 = "";
        if ((pcVar14 != (char *)0x0) && (local_60 = "", *pcVar14 != '\0')) {
          pcVar14 = (data->state).aptr.accept_encoding;
          local_60 = "";
          if (pcVar14 != (char *)0x0) {
            local_60 = pcVar14;
          }
        }
        pcVar14 = "";
        if ((data->state).referer != (char *)0x0) {
          pcVar12 = (data->state).aptr.ref;
          pcVar14 = "";
          if (pcVar12 != (char *)0x0) {
            pcVar14 = pcVar12;
          }
        }
        pcVar12 = "";
        if (((ulong)conn->bits & 9) == 1) {
          local_98 = pcVar10;
          local_90 = pcVar9;
          pcVar8 = Curl_checkheaders(data,"Proxy-Connection",0x10);
          pcVar12 = "";
          pcVar9 = local_90;
          pcVar10 = local_98;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = Curl_checkProxyheaders(data,conn,"Proxy-Connection",0x10);
            pcVar12 = "";
            pcVar9 = local_90;
            pcVar10 = local_98;
            if (pcVar8 == (char *)0x0) {
              pcVar12 = "Proxy-Connection: Keep-Alive\r\n";
            }
          }
        }
        pcVar8 = local_40;
        pcVar13 = "";
        if (local_40 != (char *)0x0) {
          pcVar13 = local_40;
        }
        CVar3 = Curl_dyn_addf(&req," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s",pcVar5,pcVar9,pcVar10,
                              pcVar11,local_48,local_50,local_58,pcVar6,local_60,pcVar14,pcVar12,te,
                              pcVar13);
        (*Curl_cfree)((data->state).aptr.userpwd);
        (data->state).aptr.userpwd = (char *)0x0;
        (*Curl_cfree)((data->state).aptr.proxyuserpwd);
        (data->state).aptr.proxyuserpwd = (char *)0x0;
        (*Curl_cfree)(pcVar8);
        if (CVar3 == CURLE_OK) {
          _Var2 = Curl_conn_is_ssl(conn,0);
          if ((((httpversion < 0x14) && (!_Var2)) && (((data->state).http_neg.wanted & 2) != 0)) &&
             (((data->state).http_neg.field_0x3 & 1) != 0)) {
            Curl_dyn_free(&req);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          CVar3 = http_cookies(data,conn,&req);
          if ((((CVar3 == CURLE_OK) &&
               ((conn->handler->protocol < 0x40000000 ||
                (CVar3 = Curl_ws_request(data,&req), CVar3 == CURLE_OK)))) &&
              (CVar3 = Curl_add_timecondition(data,&req), CVar3 == CURLE_OK)) &&
             ((CVar3 = Curl_add_custom_headers(data,false,uVar15,&req), CVar3 == CURLE_OK &&
              (CVar3 = http_req_complete(data,&req,uVar15,httpreq), CVar3 == CURLE_OK)))) {
            CVar3 = Curl_req_send(data,&req,httpversion);
            Curl_dyn_free(&req);
            if (CVar3 == CURLE_OK && 0x13 < httpversion) {
              uVar15 = *(uint *)&(data->req).field_0xd1;
              if ((short)uVar15 < 0) {
                *(uint *)&(data->req).field_0xd1 = uVar15 & 0xffff7fff;
                return CURLE_OK;
              }
              return CURLE_OK;
            }
            goto LAB_00133bc3;
          }
        }
      }
      Curl_dyn_free(&req);
    }
  }
LAB_00133bc3:
  if (CVar3 == CURLE_TOO_LARGE) {
    Curl_failf(data,"HTTP request too large");
    CVar3 = CURLE_TOO_LARGE;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */
  unsigned char httpversion;

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  switch(conn->alpn) {
  case CURL_HTTP_VERSION_3:
    DEBUGASSERT(Curl_conn_http_version(data, conn) == 30);
    break;
  case CURL_HTTP_VERSION_2:
#ifndef CURL_DISABLE_PROXY
    if((Curl_conn_http_version(data, conn) != 20) &&
       conn->bits.proxy && !conn->bits.tunnel_proxy
      ) {
      result = Curl_http2_switch(data);
      if(result)
        goto fail;
    }
    else
#endif
      DEBUGASSERT(Curl_conn_http_version(data, conn) == 20);
    break;
  case CURL_HTTP_VERSION_1_1:
    /* continue with HTTP/1.x when explicitly requested */
    break;
  default:
    /* Check if user wants to use HTTP/2 with clear TCP */
    if(Curl_http2_may_switch(data)) {
      DEBUGF(infof(data, "HTTP/2 over clean TCP"));
      result = Curl_http2_switch(data);
      if(result)
        goto fail;
    }
    break;
  }

  /* Add collecting of headers written to client. For a new connection,
   * we might have done that already, but reuse
   * or multiplex needs it here as well. */
  result = Curl_headers_init(data);
  if(result)
    goto fail;

  result = http_host(data, conn);
  if(result)
    goto fail;

  result = http_useragent(data);
  if(result)
    goto fail;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      goto fail;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer"))) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
     data->set.str[STRING_ENCODING]) {
    free(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = http_transferencode(data);
  if(result)
    goto fail;
#endif

  httpversion = http_request_version(data);
  httpstring = get_http_string(httpversion);

  result = http_req_set_reader(data, httpreq, httpversion, &te);
  if(result)
    goto fail;

  p_accept = Curl_checkheaders(data,
                               STRCONST("Accept")) ? NULL : "Accept: */*\r\n";

  result = http_range(data, httpreq);
  if(result)
    goto fail;

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, STRCONST("Alt-Used"))) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host ? data->state.aptr.host : ""),
#ifndef CURL_DISABLE_PROXY
                  data->state.aptr.proxyuserpwd ?
                  data->state.aptr.proxyuserpwd : "",
#else
                  "",
#endif
                  data->state.aptr.userpwd ? data->state.aptr.userpwd : "",
                  (data->state.use_range && data->state.aptr.rangeline) ?
                  data->state.aptr.rangeline : "",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent) ?
                  data->state.aptr.uagent : "",
                  p_accept ? p_accept : "",
                  data->state.aptr.te ? data->state.aptr.te : "",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding) ?
                  data->state.aptr.accept_encoding : "",
                  (data->state.referer && data->state.aptr.ref) ?
                  data->state.aptr.ref : "" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, STRCONST("Proxy-Connection")) &&
                   !Curl_checkProxyheaders(data, conn,
                                           STRCONST("Proxy-Connection"))) ?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid reusing old credentials
   * from reused connections */
  Curl_safefree(data->state.aptr.userpwd);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuserpwd);
#endif
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET) && (httpversion < 20) &&
     (data->state.http_neg.wanted & CURL_HTTP_V2x) &&
     data->state.http_neg.h2_upgrade) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it is not done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = http_cookies(data, conn, &req);
#ifndef CURL_DISABLE_WEBSOCKETS
  if(!result && conn->handler->protocol&(CURLPROTO_WS|CURLPROTO_WSS))
    result = Curl_ws_request(data, &req);
#endif
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, httpversion, &req);

  if(!result) {
    /* req_send takes ownership of the 'req' memory on success */
    result = http_req_complete(data, &req, httpversion, httpreq);
    if(!result)
      result = Curl_req_send(data, &req, httpversion);
  }
  Curl_dyn_free(&req);
  if(result)
    goto fail;

  if((httpversion >= 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
fail:
  if(CURLE_TOO_LARGE == result)
    failf(data, "HTTP request too large");
  return result;
}